

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *child1States,float *child1TransMat,
          int *child2States,float *child2TransMat,float *scaleFactors,int startPattern,
          int endPattern)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  
  iVar2 = this->kPatternCount;
  uVar3 = this->kCategoryCount;
  iVar4 = this->kPartialsPaddedStateCount;
  for (uVar13 = 0; uVar13 != (~((int)uVar3 >> 0x1f) & uVar3); uVar13 = uVar13 + 1) {
    iVar5 = this->kMatrixSize;
    uVar6 = this->kStateCount;
    iVar15 = (iVar2 * uVar13 + startPattern) * iVar4;
    for (lVar16 = (long)startPattern; lVar16 < endPattern; lVar16 = lVar16 + 1) {
      iVar7 = child1States[lVar16];
      iVar8 = this->kTransPaddedStateCount;
      fVar1 = scaleFactors[lVar16];
      iVar9 = child2States[lVar16];
      lVar12 = (long)(int)(iVar5 * uVar13);
      for (lVar14 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != (uint)lVar14; lVar14 = lVar14 + 1) {
        lVar10 = iVar7 + lVar12;
        lVar11 = iVar9 + lVar12;
        lVar12 = lVar12 + iVar8;
        destP[iVar15 + lVar14] = (child1TransMat[lVar10] * child2TransMat[lVar11]) / fVar1;
      }
      iVar15 = iVar15 + (uint)lVar14;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                     const int* child1States,
                                                                     const REALTYPE* child1TransMat,
                                                                     const int* child2States,
                                                                     const REALTYPE* child2TransMat,
                                                                     const REALTYPE* scaleFactors,
                                                                     int startPattern,
                                                                     int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = child1States[k];
            const int state2 = child2States[k];
            int w = l * kMatrixSize;
            REALTYPE scaleFactor = scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = child1TransMat[w + state1] *
                           child2TransMat[w + state2] / scaleFactor;
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}